

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
camp::tuple_cat_pair<camp::tuple<int,char>&,camp::tuple<float,std::__cxx11::string>&,0l,1l,0l,1l>
          (tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,camp *this,
          tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *l)

{
  tuple_element_t<0L,_tuple<int,_char>_> *rest;
  tuple_element_t<1L,_tuple<int,_char>_> *rest_1;
  tuple_element_t<0L,_tuple<float,_basic_string<char>_>_> *rest_2;
  tuple_element_t<1L,_tuple<float,_basic_string<char>_>_> *rest_3;
  tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *r_local;
  tuple<int,_char> *l_local;
  
  rest = get<0l,int,char>((tuple<int,_char> *)this);
  rest_1 = get<1l,int,char>((tuple<int,_char> *)this);
  rest_2 = get<0l,float,std::__cxx11::string>(l);
  rest_3 = get<1l,float,std::__cxx11::string>(l);
  tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<int_&,_char_&,_float_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nullptr>
            (__return_storage_ptr__,rest,rest_1,rest_2,rest_3);
  return __return_storage_ptr__;
}

Assistant:

CAMP_HOST_DEVICE constexpr auto tuple_cat_pair(L&& l,
                                               camp::idx_seq<Lidx...>,
                                               R&& r,
                                               camp::idx_seq<Ridx...>) noexcept
{
  return ::camp::tuple<camp::at_v<typename std::decay_t<L>::TList, Lidx>...,
                       camp::at_v<typename std::decay_t<R>::TList, Ridx>...>(
      ::camp::get<Lidx>(std::forward<L>(l))...,
      ::camp::get<Ridx>(std::forward<R>(r))...);
}